

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strcspn(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  char *pcVar1;
  uint uVar2;
  sxi32 sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iLen;
  int iMasklen;
  char *zString;
  SyString sToken;
  int local_50;
  uint local_4c;
  char *local_48;
  SyString local_40;
  
  if (1 < nArg) {
    pcVar4 = jx9_value_to_string(*apArg,&local_50);
    local_48 = pcVar4;
    pcVar5 = jx9_value_to_string(apArg[1],(int *)&local_4c);
    if (0 < local_50) {
      iVar6 = local_50;
      if ((int)local_4c < 1) goto LAB_0012caa9;
      if (nArg == 2) {
LAB_0012ca38:
        sVar3 = ExtractNonSpaceToken(&local_48,pcVar4 + local_50,&local_40);
        iVar6 = 0;
        if (local_40.nByte != 0 && sVar3 == 0) {
          if ((int)local_4c < 1) {
            local_4c = 0;
          }
          for (pcVar4 = local_40.zString; pcVar4 < local_40.zString + (int)local_40.nByte;
              pcVar4 = pcVar4 + 1) {
            uVar8 = 0;
            while (local_4c != uVar8) {
              pcVar1 = pcVar5 + uVar8;
              uVar8 = uVar8 + 1;
              if (*pcVar4 == *pcVar1) goto LAB_0012cabf;
            }
          }
LAB_0012cabf:
          iVar6 = (int)pcVar4 - (int)local_40.zString;
        }
        goto LAB_0012caa9;
      }
      uVar2 = jx9_value_to_int(apArg[2]);
      if ((int)uVar2 < 0) {
        uVar7 = local_50 + uVar2;
        if (uVar7 != 0 && SCARRY4(local_50,uVar2) == (int)uVar7 < 0) {
          iVar6 = -uVar2;
          uVar2 = uVar7;
          goto LAB_0012ca0e;
        }
      }
      else {
        iVar6 = local_50 - uVar2;
        if (iVar6 != 0 && (int)uVar2 <= local_50) {
LAB_0012ca0e:
          pcVar4 = pcVar4 + uVar2;
          local_50 = iVar6;
          local_48 = pcVar4;
          if ((3 < (uint)nArg) &&
             (iVar6 = jx9_value_to_int(apArg[3]), iVar6 < local_50 && 0 < iVar6)) {
            local_50 = iVar6;
          }
          goto LAB_0012ca38;
        }
      }
    }
  }
  iVar6 = 0;
LAB_0012caa9:
  jx9_result_int(pCtx,iVar6);
  return 0;
}

Assistant:

static int jx9Builtin_strcspn(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zString, *zMask, *zEnd;
	int iMasklen, iLen;
	SyString sToken;
	int iCount = 0;
	int rc;
	if( nArg < 2 ){
		/* Missing agruments, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target string */
	zString = jx9_value_to_string(apArg[0], &iLen);
	/* Extract the mask */
	zMask = jx9_value_to_string(apArg[1], &iMasklen);
	if( iLen < 1 ){
		/* Nothing to process, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( iMasklen < 1 ){
		/* No given mask, return the string length */
		jx9_result_int(pCtx, iLen);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 ){
			const char *zBase = &zString[iLen + nOfft];
			if( zBase > zString ){
				iLen = (int)(&zString[iLen]-zBase);
				zString = zBase;	
			}else{
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}
		}else{
			if( nOfft >= iLen ){
				/* Invalid offset */
				jx9_result_int(pCtx, 0);
				return JX9_OK;
			}else{
				/* Update offset */
				zString += nOfft;
				iLen -= nOfft;
			}
		}
		if( nArg > 3 ){
			int iUserlen;
			/* Extract the desired length */
			iUserlen = jx9_value_to_int(apArg[3]);
			if( iUserlen > 0 && iUserlen < iLen ){
				iLen = iUserlen;
			}
		}
	}
	/* Point to the end of the string */
	zEnd = &zString[iLen];
	/* Extract the first non-space token */
	rc = ExtractNonSpaceToken(&zString, zEnd, &sToken);
	if( rc == SXRET_OK && sToken.nByte > 0 ){
		/* Compare against the current mask */
		iCount = LongestStringMask2(sToken.zString, (int)sToken.nByte, zMask, iMasklen);
	}
	/* Longest match */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}